

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O3

void TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontNonSym<float>_>::main(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  TPZVec<long> DestInd3;
  TPZVec<long> DestInd2;
  TPZVec<long> DestInd1;
  TPZVec<int> NumConnected;
  TPZFMatrix<float> KEl1;
  TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontNonSym<float>_> TestFront;
  TPZFMatrix<float> TStack_16198;
  _func_int **pp_Stack_16108;
  _func_int **pp_Stack_16100;
  _func_int **pp_Stack_160f8;
  TPZVec<long> TStack_160f0;
  TPZVec<long> TStack_160d0;
  TPZVec<long> TStack_160b0;
  TPZVec<int> TStack_16090;
  TPZFMatrix<float> TStack_16070;
  TPZFMatrix<float> TStack_15fe0;
  TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontNonSym<float>_> TStack_15f50;
  
  TStack_16070.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 2;
  TStack_16070.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 2;
  TStack_16070.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  TStack_16070.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  TStack_16070.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  TStack_16070.fElem = (float *)0x0;
  TStack_16070.fGiven = (float *)0x0;
  TStack_16070.fSize = 0;
  TPZVec<int>::TPZVec(&TStack_16070.fPivot.super_TPZVec<int>,0);
  TStack_16070.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  TStack_16070.fPivot.super_TPZVec<int>.fStore = TStack_16070.fPivot.fExtAlloc;
  TStack_16070.fPivot.super_TPZVec<int>.fNElements = 0;
  TStack_16070.fPivot.super_TPZVec<int>.fNAlloc = 0;
  TStack_16070.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  TStack_16070.fWork.fStore = (float *)0x0;
  TStack_16070.fWork.fNElements = 0;
  TStack_16070.fWork.fNAlloc = 0;
  TStack_16070.fElem = (float *)operator_new__(0x10);
  if ((TStack_16070.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 1) ||
     (TStack_16070.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *TStack_16070.fElem = 4.0;
  if (TStack_16070.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 2) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TStack_16070.fElem[TStack_16070.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow] = 6.0;
  if ((TStack_16070.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 2) ||
     (TStack_16070.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TStack_16070.fElem[1] = 6.0;
  if ((TStack_16070.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 2) ||
     (TStack_16070.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TStack_16070.fElem[TStack_16070.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow + 1] = 12.0;
  TPZVec<long>::TPZVec(&TStack_160b0,2);
  *TStack_160b0.fStore = 0;
  TStack_160b0.fStore[1] = 1;
  TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 4;
  TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 4;
  TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  TStack_16198.fElem = (float *)0x0;
  TStack_16198.fGiven = (float *)0x0;
  TStack_16198.fSize = 0;
  TPZVec<int>::TPZVec(&TStack_16198.fPivot.super_TPZVec<int>,0);
  TStack_16198.fPivot.super_TPZVec<int>.fStore = TStack_16198.fPivot.fExtAlloc;
  TStack_16198.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  TStack_16198.fPivot.super_TPZVec<int>.fNElements = 0;
  TStack_16198.fPivot.super_TPZVec<int>.fNAlloc = 0;
  TStack_16198.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  TStack_16198.fWork.fStore = (float *)0x0;
  TStack_16198.fWork.fNElements = 0;
  TStack_16198.fWork.fNAlloc = 0;
  TStack_16198.fElem = (float *)operator_new__(0x40);
  if ((TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 1) ||
     (TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *TStack_16198.fElem = 4.0;
  if (TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 2) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TStack_16198.fElem[TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow] = -6.0;
  if ((TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 1) ||
     (TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TStack_16198.fElem[TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * 2] = 2.0;
  if ((TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 1) ||
     (TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 4)) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TStack_16198.fElem[TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * 3] = 6.0;
  if ((TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 2) ||
     (TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TStack_16198.fElem[TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow + 1] = 12.0;
  if ((TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 2) ||
     (TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TStack_16198.fElem[TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * 2 + 1] = -6.0;
  if ((TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 2) ||
     (TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 4)) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TStack_16198.fElem[TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * 3 + 1] = -12.0;
  if ((TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 3) ||
     (TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TStack_16198.fElem[TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * 2 + 2] = 4.0;
  if ((2 < TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow) &&
     (3 < TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol)) {
    TStack_16198.fElem[TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * 3 + 2] = 6.0;
    if ((TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 4) ||
       (TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pp_Stack_16108 = (_func_int **)&PTR__TPZVec_01813d70;
    pp_Stack_16100 = (_func_int **)&PTR__TPZManVector_01815498;
    pp_Stack_160f8 = (_func_int **)&PTR__TPZFMatrix_0181dbe8;
    TStack_16198.fElem[TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * 3 + 3] = 12.0;
    lVar3 = 0;
    lVar2 = 0;
    lVar1 = lVar2;
    do {
      do {
        if (TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol <= lVar2 ||
            TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= lVar1) {
          TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= lVar2) ||
           (TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol <= lVar1)) {
          TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(float *)((long)TStack_16198.fElem +
                  lVar2 * 4 + lVar3 * TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow)
             = TStack_16198.fElem
               [TStack_16198.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * lVar2 + lVar1];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      lVar2 = lVar1 + 1;
      lVar3 = lVar3 + 4;
      lVar1 = lVar2;
    } while (lVar2 != 4);
    TPZVec<long>::TPZVec(&TStack_160d0,4);
    *TStack_160d0.fStore = 0;
    TStack_160d0.fStore[1] = 1;
    TStack_160d0.fStore[2] = 2;
    TStack_160d0.fStore[3] = 3;
    TStack_15fe0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 2;
    TStack_15fe0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 2;
    TStack_15fe0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
    TStack_15fe0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
    TStack_15fe0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         pp_Stack_160f8;
    TStack_15fe0.fElem = (float *)0x0;
    TStack_15fe0.fGiven = (float *)0x0;
    TStack_15fe0.fSize = 0;
    TPZVec<int>::TPZVec(&TStack_15fe0.fPivot.super_TPZVec<int>,0);
    TStack_15fe0.fPivot.super_TPZVec<int>.fStore = TStack_15fe0.fPivot.fExtAlloc;
    TStack_15fe0.fPivot.super_TPZVec<int>._vptr_TPZVec = pp_Stack_16100;
    TStack_15fe0.fPivot.super_TPZVec<int>.fNElements = 0;
    TStack_15fe0.fPivot.super_TPZVec<int>.fNAlloc = 0;
    TStack_15fe0.fWork._vptr_TPZVec = pp_Stack_16108;
    TStack_15fe0.fWork.fStore = (float *)0x0;
    TStack_15fe0.fWork.fNElements = 0;
    TStack_15fe0.fWork.fNAlloc = 0;
    TStack_15fe0.fElem = (float *)operator_new__(0x10);
    if ((TStack_15fe0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 1) ||
       (TStack_15fe0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    *TStack_15fe0.fElem = 3.0;
    if (TStack_15fe0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 2) {
      TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    TStack_15fe0.fElem[TStack_15fe0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow] = 3.0;
    if ((1 < TStack_16070.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow) &&
       (0 < TStack_16070.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol)) {
      TStack_16070.fElem[1] = 3.0;
      if ((1 < TStack_15fe0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow) &&
         (1 < TStack_15fe0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol)) {
        TStack_15fe0.fElem[TStack_15fe0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow + 1] = 6.0;
        TPZVec<long>::TPZVec(&TStack_160f0,2);
        *TStack_160f0.fStore = 2;
        TStack_160f0.fStore[1] = 3;
        TPZFrontMatrix(&TStack_15f50,4);
        TPZVec<int>::TPZVec(&TStack_16090,4);
        TStack_16090.fStore[0] = 2;
        TStack_16090.fStore[1] = 2;
        TStack_16090.fStore[2] = 2;
        TStack_16090.fStore[3] = 2;
        SetNumElConnected(&TStack_15f50,&TStack_16090);
        SymbolicAddKel(&TStack_15f50,&TStack_160b0);
        SymbolicAddKel(&TStack_15f50,&TStack_160d0);
        SymbolicAddKel(&TStack_15f50,&TStack_160f0);
        TPZFrontNonSym<float>::AllocData(&TStack_15f50.fFront);
        TStack_15f50.fLastDecomposed = -1;
        SetNumElConnected(&TStack_15f50,&TStack_16090);
        AddKel(&TStack_15f50,&TStack_16070,&TStack_160b0);
        AddKel(&TStack_15f50,&TStack_16198,&TStack_160d0);
        AddKel(&TStack_15f50,&TStack_15fe0,&TStack_160f0);
        TStack_16090._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
        if (TStack_16090.fStore != (int *)0x0) {
          operator_delete__(TStack_16090.fStore);
        }
        ~TPZFrontMatrix(&TStack_15f50,
                        &TPZFrontMatrix<float,TPZStackEqnStorage<float>,TPZFrontNonSym<float>>::VTT)
        ;
        TStack_160f0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
        if (TStack_160f0.fStore != (long *)0x0) {
          operator_delete__(TStack_160f0.fStore);
        }
        TPZFMatrix<float>::~TPZFMatrix(&TStack_15fe0);
        TStack_160d0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
        if (TStack_160d0.fStore != (long *)0x0) {
          operator_delete__(TStack_160d0.fStore);
        }
        TPZFMatrix<float>::~TPZFMatrix(&TStack_16198);
        TStack_160b0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
        if (TStack_160b0.fStore != (long *)0x0) {
          operator_delete__(TStack_160b0.fStore);
        }
        TPZFMatrix<float>::~TPZFMatrix(&TStack_16070);
        return;
      }
      TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::main()
{
	TPZFMatrix<TVar> KEl1(2,2);
	KEl1(0,0)=4.;
	KEl1(0,1)=6.;
	KEl1(1,0)=6.;
	KEl1(1,1)=12.;
	TPZVec<int64_t> DestInd1(2);
	DestInd1[0]=0;
	DestInd1[1]=1;
	
	
	TPZFMatrix<TVar> KEl2(4,4);
	KEl2(0,0)=4.;
	KEl2(0,1)=-6.;
	KEl2(0,2)=2.;
	KEl2(0,3)=6.;
	
	KEl2(1,1)=12;
	KEl2(1,2)=-6.;
	KEl2(1,3)=-12.;
	
	KEl2(2,2)=4.;
	KEl2(2,3)=6.;
	
	KEl2(3,3)=12.;
	
	int i, j;
	for(i=0;i<4;i++) {
		for(j=i;j<4;j++) KEl2(j,i)=KEl2(i,j);
	}
	
	TPZVec<int64_t> DestInd2(4);
	DestInd2[0]=0;
	DestInd2[1]=1;
	DestInd2[2]=2;
	DestInd2[3]=3;

	TPZFMatrix<TVar> KEl3(2,2);
	KEl3(0,0)=3.;
	KEl3(0,1)=3.;
	KEl1(1,0)=3.;
	KEl3(1,1)=6.;
	
	TPZVec<int64_t> DestInd3(2);
	DestInd3[0]=2;
	DestInd3[1]=3;

	TPZFrontMatrix TestFront(4);
	
	TPZVec<int> NumConnected(4);
	for(i=0;i<4;i++) NumConnected[i]=2;
	
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.SymbolicAddKel(DestInd1);
	TestFront.SymbolicAddKel(DestInd2);
	TestFront.SymbolicAddKel(DestInd3);
	
	TestFront.AllocData();
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.AddKel(KEl1,DestInd1);
	TestFront.AddKel(KEl2,DestInd2);
	TestFront.AddKel(KEl3,DestInd3);
}